

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objects.hh
# Opt level: O0

void __thiscall discordpp::Attachment::Attachment(Attachment *this,Attachment *param_1)

{
  Attachment *param_1_local;
  Attachment *this_local;
  
  field<discordpp::Snowflake>::field(&this->id,&param_1->id);
  field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::field
            (&this->filename,&param_1->filename);
  omittable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::omittable_field(&this->description,&param_1->description);
  omittable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::omittable_field(&this->content_type,&param_1->content_type);
  field<int>::field(&this->size,&param_1->size);
  field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::field
            (&this->url,&param_1->url);
  field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::field
            (&this->proxy_url,&param_1->proxy_url);
  nullable_omittable_field<int>::nullable_omittable_field(&this->height,&param_1->height);
  nullable_omittable_field<int>::nullable_omittable_field(&this->width,&param_1->width);
  omittable_field<bool>::omittable_field(&this->ephemeral,&param_1->ephemeral);
  return;
}

Assistant:

Attachment(
        field<Snowflake> id = uninitialized,
        field<std::string> filename = uninitialized,
        omittable_field<std::string> description = omitted,
        omittable_field<std::string> content_type = omitted,
        field<int> size = uninitialized,
        field<std::string> url = uninitialized,
        field<std::string> proxy_url = uninitialized,
        nullable_omittable_field<int> height = omitted,
        nullable_omittable_field<int> width = omitted,
        omittable_field<bool> ephemeral = omitted
    ):
        id(id),
        filename(filename),
        description(description),
        content_type(content_type),
        size(size),
        url(url),
        proxy_url(proxy_url),
        height(height),
        width(width),
        ephemeral(ephemeral)
    {}